

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toplevel_unit.c
# Opt level: O3

void issue208(void)

{
  roaring_bitmap_t *r;
  uint64_t uVar1;
  uint32_t val;
  
  r = roaring_bitmap_create_with_capacity(0);
  val = 0xffffffff;
  do {
    val = val + 2;
    roaring_bitmap_add(r,val);
  } while (val < 0x2000);
  uVar1 = roaring_bitmap_rank(r,0x3f);
  _assert_true((ulong)((int)uVar1 == 0x20),"rank == 32",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x138);
  roaring_bitmap_free(r);
  return;
}

Assistant:

bool roaring_iterator_sumall(uint32_t value, void *param) {
    *(uint32_t *)param += value;
    return true;  // continue till the end
}